

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Cloud.h
# Opt level: O0

uint __thiscall Nova::Point_Cloud<float,_2>::Add_Vertex(Point_Cloud<float,_2> *this,TV *X)

{
  size_t sVar1;
  TV *X_local;
  Point_Cloud<float,_2> *this_local;
  
  Array<Nova::Vector<float,_2,_true>_>::Append(&this->points,X);
  sVar1 = Array<Nova::Vector<float,_2,_true>_>::size(&this->points);
  return (uint)sVar1;
}

Assistant:

unsigned Add_Vertex(const TV& X)
    {
        points.Append(X);
        return points.size();
    }